

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O1

int dwarf_dnames_abbrevtable
              (Dwarf_Dnames_Head dn,Dwarf_Unsigned index,Dwarf_Unsigned *abbrev_offset,
              Dwarf_Unsigned *abbrev_code,Dwarf_Unsigned *abbrev_tag,Dwarf_Unsigned array_size,
              Dwarf_Half *idxattr_array,Dwarf_Half *form_array,Dwarf_Unsigned *attr_count)

{
  Dwarf_D_Abbrev_s *pDVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = -1;
  if (((dn != (Dwarf_Dnames_Head)0x0) &&
      (iVar2 = -1, form_array != (Dwarf_Half *)0x0 && idxattr_array != (Dwarf_Half *)0x0)) &&
     (index < dn->dn_abbrev_instance_count)) {
    pDVar1 = dn->dn_abbrev_instances;
    if (abbrev_offset != (Dwarf_Unsigned *)0x0) {
      *abbrev_offset = pDVar1[index].da_abbrev_offset;
    }
    if (abbrev_code != (Dwarf_Unsigned *)0x0) {
      *abbrev_code = pDVar1[index].da_abbrev_code;
    }
    if (abbrev_tag != (Dwarf_Unsigned *)0x0) {
      *abbrev_tag = pDVar1[index].da_tag;
    }
    uVar3 = pDVar1[index].da_pairs_count;
    if (attr_count != (Dwarf_Unsigned *)0x0) {
      *attr_count = uVar3;
    }
    if (uVar3 < array_size) {
      array_size = uVar3;
    }
    iVar2 = 0;
    if (array_size != 0) {
      uVar3 = 0;
      do {
        idxattr_array[uVar3] = pDVar1[index].da_idxattr[uVar3];
        form_array[uVar3] = pDVar1[index].da_form[uVar3];
        uVar3 = uVar3 + 1;
      } while (array_size != uVar3);
    }
  }
  return iVar2;
}

Assistant:

int
dwarf_dnames_abbrevtable(Dwarf_Dnames_Head dn,
    Dwarf_Unsigned index,
    Dwarf_Unsigned *abbrev_offset,
    Dwarf_Unsigned *abbrev_code,
    Dwarf_Unsigned *abbrev_tag,
    Dwarf_Unsigned array_size,
    Dwarf_Half     * idxattr_array,
    Dwarf_Half     * form_array,
    Dwarf_Unsigned * attr_count)
{
    struct Dwarf_D_Abbrev_s *ab      = 0;
    Dwarf_Unsigned abnumber          = 0;
    Dwarf_Unsigned abmax             = 0;

    if (!dn) {
        return DW_DLV_NO_ENTRY;
    }
    if (!idxattr_array || !form_array) {
        return DW_DLV_NO_ENTRY;
    }
    if (index >= dn->dn_abbrev_instance_count) {
        return DW_DLV_NO_ENTRY;
    }
    ab = dn->dn_abbrev_instances + index;
    if (abbrev_offset) {
        *abbrev_offset = ab->da_abbrev_offset;
    }
    if (abbrev_code) {
        *abbrev_code = ab->da_abbrev_code;
    }
    if (abbrev_tag) {
        *abbrev_tag  = ab->da_tag;
    }
    abmax       = ab->da_pairs_count;
    if (attr_count) {
        *attr_count = abmax;
    }
    if (array_size < abmax) {
        abmax = array_size;
    }
    for ( ; abnumber < abmax; ++abnumber) {
        idxattr_array[abnumber] = ab->da_idxattr[abnumber];
        form_array[abnumber] = ab->da_form[abnumber];
    }
    return DW_DLV_OK;
}